

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFabFactory.cpp
# Opt level: O2

unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
amrex::makeEBFabFactory
          (Geometry *a_geom,BoxArray *a_ba,DistributionMapping *a_dm,
          Vector<int,_std::allocator<int>_> *a_ngrow,EBSupport a_support)

{
  int iVar1;
  IndexSpace *pIVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000084;
  
  pIVar2 = EB2::IndexSpace::top();
  iVar1 = (*pIVar2->_vptr_IndexSpace[2])(pIVar2,a_ba);
  std::
  make_unique<amrex::EBFArrayBoxFactory,amrex::EB2::Level_const&,amrex::Geometry_const&,amrex::BoxArray_const&,amrex::DistributionMapping_const&,amrex::Vector<int,std::allocator<int>>const&,amrex::EBSupport&>
            ((Level *)a_geom,(Geometry *)CONCAT44(extraout_var,iVar1),a_ba,a_dm,a_ngrow,
             (EBSupport *)CONCAT44(in_register_00000084,a_support));
  return (__uniq_ptr_data<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>,_true,_true>
          )(__uniq_ptr_data<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>,_true,_true>
            )a_geom;
}

Assistant:

std::unique_ptr<EBFArrayBoxFactory>
makeEBFabFactory (const Geometry& a_geom,
                  const BoxArray& a_ba,
                  const DistributionMapping& a_dm,
                  const Vector<int>& a_ngrow, EBSupport a_support)
{
    const EB2::IndexSpace& index_space = EB2::IndexSpace::top();
    const EB2::Level& eb_level = index_space.getLevel(a_geom);
    return std::make_unique<EBFArrayBoxFactory>(eb_level, a_geom, a_ba, a_dm, a_ngrow, a_support);
}